

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

pboolean p_socket_connect(PSocket *socket,PSocketAddress *address,PError **error)

{
  pboolean pVar1;
  int iVar2;
  pint err_code;
  PErrorIO code;
  psize pVar3;
  char *message;
  sockaddr_storage buffer;
  sockaddr local_b0 [8];
  
  if ((socket == (PSocket *)0x0) || (address == (PSocketAddress *)0x0)) {
    p_socket_connect_cold_3();
  }
  else if ((socket->field_0x18 & 4) == 0) {
    pVar1 = p_socket_address_to_native(address,local_b0,0x80);
    if (pVar1 == 0) {
      p_socket_connect_cold_2();
    }
    else {
      do {
        iVar2 = socket->fd;
        pVar3 = p_socket_address_get_native_size(address);
        iVar2 = connect(iVar2,local_b0,(socklen_t)pVar3);
        err_code = 4;
        if (iVar2 == 0) break;
        err_code = p_error_get_last_net();
      } while (err_code == 4);
      if (iVar2 == 0) {
LAB_001154c5:
        socket->field_0x18 = socket->field_0x18 | 8;
        return 1;
      }
      code = p_error_get_io_from_system(err_code);
      if ((code == P_ERROR_IO_WOULD_BLOCK) || (code == P_ERROR_IO_IN_PROGRESS)) {
        if ((socket->field_0x18 & 1) != 0) {
          pVar1 = p_socket_io_condition_wait(socket,P_SOCKET_IO_CONDITION_POLLOUT,error);
          if (pVar1 == 0) {
            return 0;
          }
          pVar1 = p_socket_check_connect_result(socket,error);
          if (pVar1 == 0) {
            return 0;
          }
          goto LAB_001154c5;
        }
        message = "Couldn\'t block non-blocking socket";
      }
      else {
        message = "Failed to call connect() on socket";
      }
      p_error_set_error_p(error,code,err_code,message);
    }
  }
  else {
    p_socket_connect_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_connect (PSocket		*socket,
		  PSocketAddress	*address,
		  PError		**error)
{
	struct sockaddr_storage	buffer;
	pint			err_code;
	pint			conn_result;
	PErrorIO		sock_err;

	if (P_UNLIKELY (socket == NULL || address == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (P_UNLIKELY (p_socket_address_to_native (address, &buffer, sizeof (buffer)) == FALSE)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     0,
				     "Failed to convert socket address to native structure");
		return FALSE;
	}

#if !defined (P_OS_WIN) && defined (EINTR)
	for (;;) {
		conn_result = connect (socket->fd, (struct sockaddr *) &buffer,
				       (socklen_t) p_socket_address_get_native_size (address));

		if (P_LIKELY (conn_result == 0))
			break;

		err_code = p_error_get_last_net ();

		if (err_code == EINTR)
			continue;
		else
			break;
	}
#else
	conn_result = connect (socket->fd, (struct sockaddr *) &buffer,
			       (pint) p_socket_address_get_native_size (address));

	if (conn_result != 0)
		err_code = p_error_get_last_net ();
#endif

	if (conn_result == 0) {
		socket->connected = TRUE;
		return TRUE;
	}

	sock_err = p_error_get_io_from_system (err_code);

	if (P_LIKELY (sock_err == P_ERROR_IO_WOULD_BLOCK || sock_err == P_ERROR_IO_IN_PROGRESS)) {
		if (socket->blocking) {
			if (p_socket_io_condition_wait (socket,
							P_SOCKET_IO_CONDITION_POLLOUT,
							error) == TRUE &&
			    p_socket_check_connect_result (socket, error) == TRUE) {
				socket->connected = TRUE;
				return TRUE;
			}
		} else
			p_error_set_error_p (error,
					     (pint) sock_err,
					     err_code,
					     "Couldn't block non-blocking socket");
	} else
		p_error_set_error_p (error,
				     (pint) sock_err,
				     err_code,
				     "Failed to call connect() on socket");

	return FALSE;
}